

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_side_has_id(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT id,REF_BOOL *has_id)

{
  REF_INT local_48;
  REF_INT local_44;
  int local_40;
  int local_3c;
  REF_INT local_38;
  REF_INT cell_edge;
  REF_INT cell;
  REF_INT item;
  REF_BOOL *has_id_local;
  REF_INT id_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_CELL ref_cell_local;
  
  *has_id = 0;
  if (ref_cell->last_node_is_an_id != 0) {
    if ((node0 < 0) || (ref_cell->ref_adj->nnode <= node0)) {
      local_40 = -1;
    }
    else {
      local_40 = ref_cell->ref_adj->first[node0];
    }
    cell_edge = local_40;
    if (local_40 == -1) {
      local_44 = -1;
    }
    else {
      local_44 = ref_cell->ref_adj->item[local_40].ref;
    }
    local_38 = local_44;
    while (cell_edge != -1) {
      for (local_3c = 0; local_3c < ref_cell->edge_per; local_3c = local_3c + 1) {
        if ((((node0 == ref_cell->c2n[ref_cell->e2n[local_3c << 1] + ref_cell->size_per * local_38])
             && (node1 == ref_cell->c2n
                          [ref_cell->e2n[local_3c * 2 + 1] + ref_cell->size_per * local_38])) ||
            ((node0 == ref_cell->c2n
                       [ref_cell->e2n[local_3c * 2 + 1] + ref_cell->size_per * local_38] &&
             (node1 == ref_cell->c2n[ref_cell->e2n[local_3c << 1] + ref_cell->size_per * local_38]))
            )) && (id == ref_cell->c2n[ref_cell->node_per + ref_cell->size_per * local_38])) {
          *has_id = 1;
          return 0;
        }
      }
      cell_edge = ref_cell->ref_adj->item[cell_edge].next;
      if (cell_edge == -1) {
        local_48 = -1;
      }
      else {
        local_48 = ref_cell->ref_adj->item[cell_edge].ref;
      }
      local_38 = local_48;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_side_has_id(REF_CELL ref_cell, REF_INT node0,
                                        REF_INT node1, REF_INT id,
                                        REF_BOOL *has_id) {
  REF_INT item, cell;
  REF_INT cell_edge;

  *has_id = REF_FALSE;

  if (!ref_cell_last_node_is_an_id(ref_cell)) return REF_SUCCESS;

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), node0, item, cell)
      each_ref_cell_cell_edge(
          ref_cell,
          cell_edge) if ((node0 == ref_cell_e2n(ref_cell, 0, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 1, cell_edge, cell)) ||
                         (node0 == ref_cell_e2n(ref_cell, 1, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(
                                  ref_cell, 0, cell_edge,
                                  cell))) if (id ==
                                              ref_cell_c2n(
                                                  ref_cell,
                                                  ref_cell_node_per(ref_cell),
                                                  cell)) {
    *has_id = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}